

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O0

QVariant * __thiscall
SongListModel::data(QVariant *__return_storage_ptr__,SongListModel *this,QModelIndex *index,int role
                   )

{
  bool bVar1;
  int iVar2;
  QString local_b8;
  QArrayDataPointer<char16_t> local_90;
  QString local_78;
  type local_60;
  const_reference local_48;
  value_type *meta;
  QModelIndex *pQStack_38;
  int role_local;
  QModelIndex *index_local;
  SongListModel *this_local;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  meta._4_4_ = role;
  pQStack_38 = index;
  index_local = (QModelIndex *)this;
  this_local = (SongListModel *)__return_storage_ptr__;
  bVar1 = QModelIndex::isValid(index);
  if ((bVar1) && ((meta._4_4_ & 0xfffffffd) == 0)) {
    iVar2 = QModelIndex::row(pQStack_38);
    local_48 = std::vector<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>::
               operator[](&this->mSongData,(long)iVar2);
    if (meta._4_4_ == 0) {
      str = L"%1# %2";
      local_20 = L"%1# %2";
      local_10 = &local_90;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_90,(Data *)0x0,L"%1# %2",6);
      QString::QString(&local_78,&local_90);
      iVar2 = QModelIndex::row(pQStack_38);
      QString::number((int)&local_b8,iVar2 + 1);
      QString::arg<QString,QString_const&>(&local_60,&local_78,&local_b8,&local_48->name);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&local_60);
      QString::~QString(&local_60);
      QString::~QString(&local_b8);
      QString::~QString(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    else {
      QVariant::QVariant(__return_storage_ptr__,(QString *)local_48);
    }
  }
  else {
    QVariant::QVariant(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant SongListModel::data(QModelIndex const& index, int role) const {

    if (index.isValid()) {
        switch (role) {
            case Qt::DisplayRole:
            case Qt::EditRole: {
                auto const& meta = mSongData[index.row()];
                if (role == Qt::DisplayRole) {
                    return QStringLiteral("%1# %2").arg(QString::number(index.row() + 1), meta.name);
                } else {
                    return meta.name;
                }
            }
            default:
                break;
        }
    }

    return {};

}